

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

uint32_t fill_with_sine(float *buf,uint32_t rate,uint32_t channels,uint32_t frames,
                       uint32_t initial_phase)

{
  uint32_t uVar1;
  uint32_t i;
  uint32_t uVar2;
  int iVar3;
  double dVar4;
  
  iVar3 = 0;
  for (uVar2 = 0; uVar2 != frames; uVar2 = uVar2 + 1) {
    for (uVar1 = 0; channels != uVar1; uVar1 = uVar1 + 1) {
      dVar4 = sin((double)((float)initial_phase / (float)rate) * 2764.6016120910645);
      buf[uVar1 + iVar3] = (float)(dVar4 * 0.5);
    }
    initial_phase = initial_phase + 1;
    iVar3 = channels + iVar3;
  }
  return initial_phase;
}

Assistant:

uint32_t
fill_with_sine(float * buf, uint32_t rate, uint32_t channels, uint32_t frames,
               uint32_t initial_phase)
{
  uint32_t offset = 0;
  for (uint32_t i = 0; i < frames; i++) {
    float p = initial_phase++ / static_cast<float>(rate);
    for (uint32_t j = 0; j < channels; j++) {
      buf[offset++] = 0.5 * sin(440. * 2 * PI * p);
    }
  }
  return initial_phase;
}